

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yin.c
# Opt level: O2

int thresholded_search(int32 *diff_window,fixed32 threshold,int start,int end)

{
  int iVar1;
  ulong uVar2;
  int i;
  ulong uVar3;
  int iVar4;
  
  uVar3 = (ulong)start;
  uVar2 = 0;
  iVar4 = 0x7fffffff;
  while( true ) {
    if ((long)end <= (long)uVar3) {
      return (int)uVar2;
    }
    iVar1 = diff_window[uVar3];
    if (iVar1 < threshold) break;
    if (iVar1 < iVar4) {
      uVar2 = uVar3 & 0xffffffff;
      iVar4 = iVar1;
    }
    uVar3 = uVar3 + 1;
  }
  return (int)uVar3;
}

Assistant:

int
thresholded_search(int32 *diff_window, fixed32 threshold, int start, int end)
{
    int i, min, argmin;

    min = INT_MAX;
    argmin = 0;
    for (i = start; i < end; ++i) {
        int diff = diff_window[i];

        if (diff < threshold) {
            min = diff;
            argmin = i;
            break;
        }
        if (diff < min) {
            min = diff;
            argmin = i;
        }
    }
    return argmin;
}